

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::DataTypeApplyOp(ImGuiDataType data_type,int op,void *output,void *arg1,void *arg2)

{
  char cVar1;
  short sVar2;
  uint uVar3;
  char cVar4;
  short sVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char cVar9;
  short sVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  float fVar14;
  double dVar15;
  
  if ((op != 0x2b) && (op != 0x2d)) {
    __assert_fail("op == \'+\' || op == \'-\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x707,
                  "void ImGui::DataTypeApplyOp(ImGuiDataType, int, void *, const void *, const void *)"
                 );
  }
  switch(data_type) {
  case 0:
    if (op == 0x2b) {
      cVar4 = *arg1;
      cVar1 = *arg2;
      if (cVar1 < '\0') {
        cVar9 = -0x80;
        if (-0x80 - cVar1 <= (int)cVar4) goto LAB_0015dfdb;
      }
      else if ((cVar1 == '\0') || (cVar9 = '\x7f', (int)cVar4 <= 0x7f - cVar1)) {
LAB_0015dfdb:
        cVar9 = cVar1 + cVar4;
      }
    }
    else {
      if (op != 0x2d) {
        return;
      }
      cVar4 = *arg1;
      cVar1 = *arg2;
      if (cVar1 < '\x01') {
        if ((cVar1 == '\0') || (cVar9 = '\x7f', (int)cVar4 <= (int)((int)cVar1 + 0x7fU)))
        goto LAB_0015e028;
      }
      else {
        cVar9 = -0x80;
        if ((int)((int)cVar1 | 0xffffff80U) <= (int)cVar4) {
LAB_0015e028:
          cVar9 = cVar4 - cVar1;
        }
      }
    }
    *(char *)output = cVar9;
    break;
  case 1:
    if (op == 0x2b) {
      cVar4 = -1;
      if (!CARRY1(*arg2,*arg1)) {
        cVar4 = *arg2 + *arg1;
      }
      *(char *)output = cVar4;
    }
    else if (op == 0x2d) {
      cVar4 = *arg1 - *arg2;
      if (*arg1 < *arg2) {
        cVar4 = '\0';
      }
      *(char *)output = cVar4;
    }
    break;
  case 2:
    if (op == 0x2b) {
      sVar10 = *arg1;
      sVar2 = *arg2;
      if (sVar2 < 0) {
        sVar5 = -0x8000;
        if (-0x8000 - sVar2 <= (int)sVar10) goto LAB_0015dfc9;
      }
      else if ((sVar2 == 0) || (sVar5 = 0x7fff, (int)sVar10 <= 0x7fff - sVar2)) {
LAB_0015dfc9:
        sVar5 = sVar2 + sVar10;
      }
    }
    else {
      if (op != 0x2d) {
        return;
      }
      sVar10 = *arg1;
      sVar2 = *arg2;
      if (sVar2 < 1) {
        if ((sVar2 == 0) || (sVar5 = 0x7fff, (int)sVar10 <= (int)((int)sVar2 + 0x7fffU)))
        goto LAB_0015e011;
      }
      else {
        sVar5 = -0x8000;
        if ((int)((int)sVar2 | 0xffff8000U) <= (int)sVar10) {
LAB_0015e011:
          sVar5 = sVar10 - sVar2;
        }
      }
    }
    *(short *)output = sVar5;
    break;
  case 3:
    if (op == 0x2b) {
      sVar10 = -1;
      if (!CARRY2(*arg2,*arg1)) {
        sVar10 = *arg2 + *arg1;
      }
      *(short *)output = sVar10;
    }
    else if (op == 0x2d) {
      sVar10 = *arg1 - *arg2;
      if (*arg1 < *arg2) {
        sVar10 = 0;
      }
      *(short *)output = sVar10;
    }
    break;
  case 4:
    if (op != 0x2b) {
      if (op != 0x2d) {
        return;
      }
      iVar6 = *arg1;
      uVar3 = *arg2;
      iVar12 = -0x80000000;
      if ((int)uVar3 < 1 || (int)(uVar3 | 0x80000000) <= iVar6) {
        iVar12 = 0x7fffffff;
        if (iVar6 <= (int)(uVar3 + 0x7fffffff)) {
          iVar12 = iVar6 - uVar3;
        }
        if (-1 < (int)uVar3) {
          iVar12 = iVar6 - uVar3;
        }
      }
      *(int *)output = iVar12;
      return;
    }
    iVar12 = *arg1;
    uVar3 = *arg2;
    iVar6 = -0x80000000;
    if (-1 < (int)uVar3 || (int)(-0x80000000 - uVar3) <= iVar12) {
      iVar6 = 0x7fffffff;
      if (iVar12 <= (int)(uVar3 ^ 0x7fffffff)) {
        iVar6 = uVar3 + iVar12;
      }
      if ((int)uVar3 < 1) {
        iVar6 = uVar3 + iVar12;
      }
    }
    goto LAB_0015df6c;
  case 5:
    if (op == 0x2b) {
      iVar6 = -1;
      if (!CARRY4(*arg2,*arg1)) {
        iVar6 = *arg2 + *arg1;
      }
      *(int *)output = iVar6;
      return;
    }
    if (op != 0x2d) {
      return;
    }
    iVar6 = *arg1 - *arg2;
    if (*arg1 < *arg2) {
      iVar6 = 0;
    }
LAB_0015df6c:
    *(int *)output = iVar6;
    break;
  case 6:
    if (op == 0x2b) {
      lVar11 = *arg1;
      lVar7 = *arg2;
      if ((-1 < lVar7) || (lVar8 = -0x8000000000000000, -0x8000000000000000 - lVar7 <= lVar11)) {
        lVar8 = 0x7fffffffffffffff;
        if (lVar11 <= 0x7fffffffffffffff - lVar7) {
          lVar8 = lVar7 + lVar11;
        }
        if (lVar7 < 1) {
          lVar8 = lVar7 + lVar11;
        }
      }
      *(long *)output = lVar8;
    }
    else if (op == 0x2d) {
      lVar11 = *arg1;
      lVar7 = *arg2;
      if ((lVar7 < 1) || (lVar7 + -0x8000000000000000 <= lVar11)) {
        lVar8 = 0x7fffffffffffffff;
        if (lVar11 <= lVar7 + 0x7fffffffffffffff) {
          lVar8 = lVar11 - lVar7;
        }
        if (-1 < lVar7) {
          lVar8 = lVar11 - lVar7;
        }
      }
      else {
        lVar8 = -0x8000000000000000;
      }
      *(long *)output = lVar8;
    }
    break;
  case 7:
    if (op == 0x2b) {
      bVar13 = CARRY8(*arg2,*arg1);
      lVar7 = *arg2 + *arg1;
      lVar11 = -1;
    }
    else {
      if (op != 0x2d) {
        return;
      }
      lVar11 = 0;
      bVar13 = *arg1 < *arg2;
      lVar7 = *arg1 - *arg2;
    }
    if (!bVar13) {
      lVar11 = lVar7;
    }
    *(long *)output = lVar11;
    break;
  case 8:
    if (op == 0x2b) {
      fVar14 = *arg1 + *arg2;
    }
    else {
      if (op != 0x2d) {
        return;
      }
      fVar14 = *arg1 - *arg2;
    }
    *(float *)output = fVar14;
    break;
  case 9:
    if (op == 0x2b) {
      dVar15 = *arg1 + *arg2;
    }
    else {
      if (op != 0x2d) {
        return;
      }
      dVar15 = *arg1 - *arg2;
    }
    *(double *)output = dVar15;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x734,
                  "void ImGui::DataTypeApplyOp(ImGuiDataType, int, void *, const void *, const void *)"
                 );
  }
  return;
}

Assistant:

void ImGui::DataTypeApplyOp(ImGuiDataType data_type, int op, void* output, const void* arg1, const void* arg2)
{
    IM_ASSERT(op == '+' || op == '-');
    switch (data_type)
    {
        case ImGuiDataType_S8:
            if (op == '+') { *(ImS8*)output  = ImAddClampOverflow(*(const ImS8*)arg1,  *(const ImS8*)arg2,  IM_S8_MIN,  IM_S8_MAX); }
            if (op == '-') { *(ImS8*)output  = ImSubClampOverflow(*(const ImS8*)arg1,  *(const ImS8*)arg2,  IM_S8_MIN,  IM_S8_MAX); }
            return;
        case ImGuiDataType_U8:
            if (op == '+') { *(ImU8*)output  = ImAddClampOverflow(*(const ImU8*)arg1,  *(const ImU8*)arg2,  IM_U8_MIN,  IM_U8_MAX); }
            if (op == '-') { *(ImU8*)output  = ImSubClampOverflow(*(const ImU8*)arg1,  *(const ImU8*)arg2,  IM_U8_MIN,  IM_U8_MAX); }
            return;
        case ImGuiDataType_S16:
            if (op == '+') { *(ImS16*)output = ImAddClampOverflow(*(const ImS16*)arg1, *(const ImS16*)arg2, IM_S16_MIN, IM_S16_MAX); }
            if (op == '-') { *(ImS16*)output = ImSubClampOverflow(*(const ImS16*)arg1, *(const ImS16*)arg2, IM_S16_MIN, IM_S16_MAX); }
            return;
        case ImGuiDataType_U16:
            if (op == '+') { *(ImU16*)output = ImAddClampOverflow(*(const ImU16*)arg1, *(const ImU16*)arg2, IM_U16_MIN, IM_U16_MAX); }
            if (op == '-') { *(ImU16*)output = ImSubClampOverflow(*(const ImU16*)arg1, *(const ImU16*)arg2, IM_U16_MIN, IM_U16_MAX); }
            return;
        case ImGuiDataType_S32:
            if (op == '+') { *(ImS32*)output = ImAddClampOverflow(*(const ImS32*)arg1, *(const ImS32*)arg2, IM_S32_MIN, IM_S32_MAX); }
            if (op == '-') { *(ImS32*)output = ImSubClampOverflow(*(const ImS32*)arg1, *(const ImS32*)arg2, IM_S32_MIN, IM_S32_MAX); }
            return;
        case ImGuiDataType_U32:
            if (op == '+') { *(ImU32*)output = ImAddClampOverflow(*(const ImU32*)arg1, *(const ImU32*)arg2, IM_U32_MIN, IM_U32_MAX); }
            if (op == '-') { *(ImU32*)output = ImSubClampOverflow(*(const ImU32*)arg1, *(const ImU32*)arg2, IM_U32_MIN, IM_U32_MAX); }
            return;
        case ImGuiDataType_S64:
            if (op == '+') { *(ImS64*)output = ImAddClampOverflow(*(const ImS64*)arg1, *(const ImS64*)arg2, IM_S64_MIN, IM_S64_MAX); }
            if (op == '-') { *(ImS64*)output = ImSubClampOverflow(*(const ImS64*)arg1, *(const ImS64*)arg2, IM_S64_MIN, IM_S64_MAX); }
            return;
        case ImGuiDataType_U64:
            if (op == '+') { *(ImU64*)output = ImAddClampOverflow(*(const ImU64*)arg1, *(const ImU64*)arg2, IM_U64_MIN, IM_U64_MAX); }
            if (op == '-') { *(ImU64*)output = ImSubClampOverflow(*(const ImU64*)arg1, *(const ImU64*)arg2, IM_U64_MIN, IM_U64_MAX); }
            return;
        case ImGuiDataType_Float:
            if (op == '+') { *(float*)output = *(const float*)arg1 + *(const float*)arg2; }
            if (op == '-') { *(float*)output = *(const float*)arg1 - *(const float*)arg2; }
            return;
        case ImGuiDataType_Double:
            if (op == '+') { *(double*)output = *(const double*)arg1 + *(const double*)arg2; }
            if (op == '-') { *(double*)output = *(const double*)arg1 - *(const double*)arg2; }
            return;
        case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
}